

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O2

int mu_button_ex(mu_Context *ctx,char *label,int icon,int opt)

{
  mu_Id id;
  size_t sVar1;
  int iVar2;
  int *data;
  mu_Rect rect;
  int icon_local;
  
  icon_local = icon;
  if (label == (char *)0x0) {
    data = &icon_local;
    iVar2 = 4;
  }
  else {
    sVar1 = strlen(label);
    iVar2 = (int)sVar1;
    data = (int *)label;
  }
  id = mu_get_id(ctx,data,iVar2);
  rect = mu_layout_next(ctx);
  mu_update_control(ctx,id,rect,opt);
  iVar2 = 0;
  if (ctx->mouse_pressed == 1) {
    iVar2 = (uint)(ctx->focus == id) * 2;
  }
  mu_draw_control_frame(ctx,id,rect,6,opt);
  if (label != (char *)0x0) {
    mu_draw_control_text(ctx,label,rect,0,opt);
  }
  if (icon != 0) {
    mu_draw_icon(ctx,icon,rect,ctx->style->colors[0]);
  }
  return iVar2;
}

Assistant:

int mu_button_ex(mu_Context *ctx, const char *label, int icon, int opt) {
  int res = 0;
  mu_Id id = label ? mu_get_id(ctx, label, strlen(label))
                   : mu_get_id(ctx, &icon, sizeof(icon));
  mu_Rect r = mu_layout_next(ctx);
  mu_update_control(ctx, id, r, opt);
  /* handle click */
  if (ctx->mouse_pressed == MU_MOUSE_LEFT && ctx->focus == id) {
    res |= MU_RES_SUBMIT;
  }
  /* draw */
  mu_draw_control_frame(ctx, id, r, MU_COLOR_BUTTON, opt);
  if (label) { mu_draw_control_text(ctx, label, r, MU_COLOR_TEXT, opt); }
  if (icon) { mu_draw_icon(ctx, icon, r, ctx->style->colors[MU_COLOR_TEXT]); }
  return res;
}